

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::UnaryExpr<const_unsigned_int_&>::streamReconstructedExpression
          (UnaryExpr<const_unsigned_int_&> *this,ostream *os)

{
  unsigned_long_long in_RDX;
  string local_30;
  
  StringMaker<unsigned_long_long,void>::convert_abi_cxx11_
            (&local_30,(StringMaker<unsigned_long_long,void> *)(ulong)*this->m_lhs,in_RDX);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }